

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O3

void __thiscall
VPLGrammar::Parser::ExpressionNode::BuildProgram(ExpressionNode *this,Scope *scope,ostream *out)

{
  iterator __position;
  __uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_> _Var1;
  pointer puVar2;
  ulong uVar3;
  int *piVar4;
  
  (**(code **)(*(long *)(((this->super_ASTNodeBasic).children_.
                          super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                        ._M_t + 0x28))();
  puVar2 = (this->super_ASTNodeBasic).children_.
           super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)(this->super_ASTNodeBasic).children_.
                        super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
    uVar3 = 1;
    do {
      __position._M_current =
           (scope->stack_pos_hist_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (scope->stack_pos_hist_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&scope->stack_pos_hist_,__position,
                   &scope->cur_stack_pos_);
        piVar4 = (scope->stack_pos_hist_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar2 = (this->super_ASTNodeBasic).children_.
                 super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        *__position._M_current = scope->cur_stack_pos_;
        piVar4 = __position._M_current + 1;
      }
      scope->cur_stack_pos_ = piVar4[-1];
      (scope->stack_pos_hist_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar4 + -1;
      _Var1._M_t.
      super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
      .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl =
           puVar2[uVar3]._M_t.
           super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ._M_t;
      (**(code **)(*(long *)_Var1._M_t.
                            super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                            .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl +
                  0x28))(_Var1._M_t.
                         super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                         .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl,
                         scope,out);
      uVar3 = uVar3 + 1;
      puVar2 = (this->super_ASTNodeBasic).children_.
               super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->super_ASTNodeBasic).children_.
                                   super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3));
  }
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                children_[0]->BuildProgram(scope, out);
                for (size_t i = 1; i < children_.size(); ++i) {
                    scope->SaveStackPos();
                    scope->RestoreStackPos();
                    children_[i]->BuildProgram(scope, out);
                }
            }